

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

void __thiscall
sqvector<SQObjectPtr>::resize
          (sqvector<SQObjectPtr> *this,SQUnsignedInteger newsize,SQObjectPtr *fill)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQObjectPtr *pSVar4;
  ulong uVar5;
  SQUnsignedInteger SVar6;
  long lVar7;
  
  if (this->_allocated < newsize) {
    pSVar4 = (SQObjectPtr *)sq_vm_realloc(this->_vals,this->_allocated << 4,newsize << 4);
    this->_vals = pSVar4;
    this->_allocated = newsize;
  }
  uVar5 = this->_size;
  if (uVar5 < newsize) {
    do {
      pSVar4 = this->_vals;
      SVar2 = (fill->super_SQObject)._type;
      pSVar4[uVar5].super_SQObject._type = SVar2;
      pSVar3 = (fill->super_SQObject)._unVal.pTable;
      pSVar4[uVar5].super_SQObject._unVal.pTable = pSVar3;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      uVar5 = this->_size + 1;
      this->_size = uVar5;
    } while (uVar5 < newsize);
  }
  else {
    if (newsize < uVar5) {
      lVar7 = newsize << 4;
      SVar6 = newsize;
      do {
        SQObjectPtr::~SQObjectPtr
                  ((SQObjectPtr *)((long)&(this->_vals->super_SQObject)._type + lVar7));
        SVar6 = SVar6 + 1;
        lVar7 = lVar7 + 0x10;
      } while (SVar6 < this->_size);
    }
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }